

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O2

void __thiscall absl::lts_20250127::time_internal::cctz::time_zone::Impl::Impl(Impl *this)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"UTC",&local_11);
  TimeZoneIf::UTC();
  return;
}

Assistant:

time_zone::Impl::Impl() : name_("UTC"), zone_(TimeZoneIf::UTC()) {}